

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetActionCost
          (EnvironmentNAVXYTHETALATTICE *this,int SourceX,int SourceY,int SourceTheta,
          EnvNAVXYTHETALATAction_t *action)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_R8;
  int currentmaxcost;
  uchar maxcellcost;
  int i;
  sbpl_xy_theta_cell_t interm3Dcell;
  sbpl_2Dcell_t cell;
  size_type in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar7;
  byte local_55;
  byte local_41;
  int local_40;
  sbpl_xy_theta_cell_t local_3c;
  sbpl_2Dcell_t local_30;
  long local_28;
  int local_18;
  int local_14;
  int local_4;
  
  local_28 = in_R8;
  local_18 = in_EDX;
  local_14 = in_ESI;
  sbpl_2Dcell_t::sbpl_2Dcell_t(&local_30);
  sbpl_xy_theta_cell_t::sbpl_xy_theta_cell_t(&local_3c);
  uVar3 = (**(code **)(*in_RDI + 0x208))(in_RDI,local_14,local_18);
  if ((uVar3 & 1) == 0) {
    local_4 = 1000000000;
  }
  else {
    uVar3 = (**(code **)(*in_RDI + 0x208))
                      (in_RDI,local_14 + *(char *)(local_28 + 2),local_18 + *(char *)(local_28 + 3))
    ;
    if ((uVar3 & 1) == 0) {
      local_4 = 1000000000;
    }
    else if (*(byte *)(*(long *)(in_RDI[10] + (long)(local_14 + *(char *)(local_28 + 2)) * 8) +
                      (long)(local_18 + *(char *)(local_28 + 3))) < *(byte *)((long)in_RDI + 0x89))
    {
      local_41 = 0;
      for (local_40 = 0;
          sVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                            ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                             (local_28 + 0x40)), local_40 < (int)sVar4; local_40 = local_40 + 1) {
        pvVar5 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                           ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,
                                     CONCAT13(in_stack_ffffffffffffffa3,
                                              CONCAT12(in_stack_ffffffffffffffa2,
                                                       in_stack_ffffffffffffffa0))),
                            in_stack_ffffffffffffff98);
        uVar1 = pvVar5->x;
        uVar2 = pvVar5->y;
        local_3c.theta = pvVar5->theta;
        local_3c.x = uVar1 + local_14;
        local_3c.y = uVar2 + local_18;
        if ((((local_3c.x < 0) || ((int)in_RDI[5] <= local_3c.x)) || (local_3c.y < 0)) ||
           (*(int *)((long)in_RDI + 0x2c) <= local_3c.y)) {
          return 1000000000;
        }
        if (*(byte *)(*(long *)(in_RDI[10] + (long)local_3c.x * 8) + (long)local_3c.y) < local_41) {
          local_55 = local_41;
        }
        else {
          local_55 = *(byte *)(*(long *)(in_RDI[10] + (long)local_3c.x * 8) + (long)local_3c.y);
        }
        local_41 = local_55;
        if (*(byte *)((long)in_RDI + 0x89) <= local_55) {
          return 1000000000;
        }
      }
      sVar4 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::size
                        ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)(in_RDI + 0x23));
      if ((1 < sVar4) && (*(int *)((long)in_RDI + 0x8c) <= (int)(uint)local_41)) {
        checks = checks + 1;
        local_40 = 0;
        while (iVar7 = local_40,
              sVar4 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size
                                ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                                 (local_28 + 0x10)), iVar7 < (int)sVar4) {
          pvVar6 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                             ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                              CONCAT44(iVar7,CONCAT13(in_stack_ffffffffffffffa3,
                                                      CONCAT12(in_stack_ffffffffffffffa2,
                                                               in_stack_ffffffffffffffa0))),
                              in_stack_ffffffffffffff98);
          local_30.x = (*pvVar6).x;
          local_30.x = local_30.x + local_14;
          local_30.y = (*pvVar6).y;
          local_30.y = local_30.y + local_18;
          uVar3 = (**(code **)(*in_RDI + 0x208))(in_RDI,local_30.x,local_30.y);
          if ((uVar3 & 1) == 0) {
            return 1000000000;
          }
          local_40 = local_40 + 1;
        }
      }
      if (local_41 <= *(byte *)(*(long *)(in_RDI[10] + (long)local_14 * 8) + (long)local_18)) {
        local_41 = *(byte *)(*(long *)(in_RDI[10] + (long)local_14 * 8) + (long)local_18);
      }
      if (local_41 <=
          *(byte *)(*(long *)(in_RDI[10] + (long)(local_14 + *(char *)(local_28 + 2)) * 8) +
                   (long)(local_18 + *(char *)(local_28 + 3)))) {
        local_41 = *(byte *)(*(long *)(in_RDI[10] + (long)(local_14 + *(char *)(local_28 + 2)) * 8)
                            + (long)(local_18 + *(char *)(local_28 + 3)));
      }
      local_4 = *(int *)(local_28 + 8) * (local_41 + 1);
    }
    else {
      local_4 = 1000000000;
    }
  }
  return local_4;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetActionCost(
    int SourceX, int SourceY, int SourceTheta,
    EnvNAVXYTHETALATAction_t* action)
{
    sbpl_2Dcell_t cell;
    sbpl_xy_theta_cell_t interm3Dcell;
    int i;

    // TODO - go over bounding box (minpt and maxpt) to test validity and skip
    // testing boundaries below, also order intersect cells so that the four
    // farthest pts go first

    if (!IsValidCell(SourceX, SourceY)) {
        return INFINITECOST;
    }
    if (!IsValidCell(SourceX + action->dX, SourceY + action->dY)) {
        return INFINITECOST;
    }

    if (EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY] >=
        EnvNAVXYTHETALATCfg.cost_inscribed_thresh)
    {
        return INFINITECOST;
    }

    // need to iterate over discretized center cells and compute cost based on them
    unsigned char maxcellcost = 0;
    for (i = 0; i < (int)action->interm3DcellsV.size(); i++) {
        interm3Dcell = action->interm3DcellsV.at(i);
        interm3Dcell.x = interm3Dcell.x + SourceX;
        interm3Dcell.y = interm3Dcell.y + SourceY;

        if (interm3Dcell.x < 0 || interm3Dcell.x >= EnvNAVXYTHETALATCfg.EnvWidth_c ||
            interm3Dcell.y < 0 || interm3Dcell.y >= EnvNAVXYTHETALATCfg.EnvHeight_c)
        {
            return INFINITECOST;
        }

        maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[interm3Dcell.x][interm3Dcell.y]);

        // check that the robot is NOT in the cell at which there is no valid orientation
        if (maxcellcost >= EnvNAVXYTHETALATCfg.cost_inscribed_thresh) {
            return INFINITECOST;
        }
    }

    // check collisions that for the particular footprint orientation along the action
    if (EnvNAVXYTHETALATCfg.FootprintPolygon.size() > 1 &&
        (int)maxcellcost >= EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh)
    {
        checks++;

        for (i = 0; i < (int)action->intersectingcellsV.size(); i++) {
            // get the cell in the map
            cell = action->intersectingcellsV.at(i);
            cell.x = cell.x + SourceX;
            cell.y = cell.y + SourceY;

            // check validity
            if (!IsValidCell(cell.x, cell.y)) {
                return INFINITECOST;
            }

// cost computation changed: cost = max(cost of centers of the robot along
// action) intersecting cells are only used for collision checking
//            if (EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y] > currentmaxcost) {
//              currentmaxcost = EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y];
//            }
        }
    }

    // to ensure consistency of h2D:
    maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[SourceX][SourceY]);
    int currentmaxcost = (int)__max(
            maxcellcost,
            EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY]);

    // use cell cost as multiplicative factor
    return action->cost * (currentmaxcost + 1);
}